

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadswindow.h
# Opt level: O0

int __thiscall FrobTadsWindow::printChar(FrobTadsWindow *this,int y,int x,chtype ch)

{
  int iVar1;
  pointer p_Var2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  unique_ptr<_win_st,_int_(*)(_win_st_*)> *in_RDI;
  undefined4 local_24;
  
  p_Var2 = std::unique_ptr<_win_st,_int_(*)(_win_st_*)>::get(in_RDI);
  iVar1 = wmove(p_Var2,in_ESI,in_EDX);
  if (iVar1 == -1) {
    local_24 = -1;
  }
  else {
    p_Var2 = std::unique_ptr<_win_st,_int_(*)(_win_st_*)>::get(in_RDI);
    local_24 = waddch(p_Var2,in_ECX);
  }
  return local_24;
}

Assistant:

int
    printChar( int y, int x, const chtype ch ) { return mvwaddch(this->fWin.get(), y, x, ch); }